

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_TtMinBase(word *pTruth,int *pVars,int nVars,int nVarsAll)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  word *pwVar4;
  int iVar;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  ulong uVar9;
  uint uVar10;
  
  if (nVarsAll < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x664,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  if (nVars < 1) {
    iVar = 0;
  }
  else {
    iVar1 = nVarsAll + -6;
    uVar6 = 1 << ((byte)iVar1 & 0x1f);
    uVar2 = uVar6;
    if ((int)uVar6 < 2) {
      uVar2 = 1;
    }
    uVar5 = 0;
    iVar = 0;
    do {
      bVar3 = (byte)uVar5;
      if (nVarsAll < 7) {
        if ((s_Truths6Neg[uVar5] & (*pTruth >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) ^ *pTruth)) != 0
           ) {
LAB_007472a0:
          if ((long)iVar < (long)uVar5) {
            if (pVars != (int *)0x0) {
              pVars[iVar] = pVars[uVar5];
            }
            Abc_TtSwapVars(pTruth,nVarsAll,iVar,(int)uVar5);
          }
          iVar = iVar + 1;
        }
      }
      else if (uVar5 < 6) {
        if (iVar1 != 0x1f) {
          uVar7 = 0;
          do {
            if (((pTruth[uVar7] >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) ^ pTruth[uVar7]) &
                s_Truths6Neg[uVar5]) != 0) goto LAB_007472a0;
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
      }
      else if (iVar1 != 0x1f) {
        uVar7 = (ulong)(uint)(1 << (bVar3 - 6 & 0x1f));
        uVar10 = 2 << (bVar3 - 6 & 0x1f);
        pwVar4 = pTruth + uVar7;
        pwVar8 = pTruth;
        do {
          uVar9 = 0;
          do {
            if (pwVar8[uVar9] != pwVar4[uVar9]) goto LAB_007472a0;
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
          pwVar8 = pwVar8 + uVar10;
          pwVar4 = pwVar4 + uVar10;
        } while (pwVar8 < pTruth + (int)uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nVars);
  }
  if (nVars < iVar) {
    __assert_fail("k < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x672,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  return iVar;
}

Assistant:

static inline int Abc_TtMinBase( word * pTruth, int * pVars, int nVars, int nVarsAll ) 
{
    int i, k;
    assert( nVars <= nVarsAll );
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_TtHasVar( pTruth, nVarsAll, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            Abc_TtSwapVars( pTruth, nVarsAll, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
//    assert( k == Abc_TtSupportSize(pTruth, nVars) );
    return k;
}